

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.c
# Opt level: O1

void * ticket_file_updater(void *unused)

{
  undefined8 uVar1;
  __time_t _Var2;
  int iVar3;
  char *src;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  h2o_iovec_t hVar7;
  session_ticket_vector_t tickets;
  stat st;
  char errbuf_1 [256];
  char errbuf [256];
  session_ticket_vector_t local_2e8;
  stat local_2c8;
  char local_238 [256];
  char local_138 [264];
  
  lVar6 = 1;
  do {
    iVar3 = stat((char *)conf.ticket.vars.generating.cipher,&local_2c8);
    _Var2 = local_2c8.st_mtim.tv_sec;
    uVar1 = conf.ticket.vars.generating.cipher;
    if (iVar3 == 0) {
      if (lVar6 != local_2c8.st_mtim.tv_sec) {
        local_2e8.entries = (st_session_ticket_t **)0x0;
        local_2e8.size = 0;
        local_2e8.capacity = 0;
        hVar7 = h2o_file_read((char *)conf.ticket.vars.generating.cipher);
        src = hVar7.base;
        lVar6 = _Var2;
        if (src == (char *)0x0) {
          piVar4 = __errno_location();
          strerror_r(*piVar4,local_238,0x100);
          pcVar5 = local_238;
        }
        else {
          iVar3 = parse_tickets(&local_2e8,src,hVar7.len,local_138);
          pcVar5 = local_138;
          if (iVar3 == 0) {
            if (1 < local_2e8.size) {
              qsort(local_2e8.entries,local_2e8.size,8,ticket_sort_compare);
            }
            pthread_rwlock_wrlock((pthread_rwlock_t *)&session_tickets);
            h2o_mem_swap(&session_tickets.tickets,&local_2e8,0x18);
            pthread_rwlock_unlock((pthread_rwlock_t *)&session_tickets);
            free(src);
            free_tickets(&local_2e8);
            fwrite("session ticket secrets have been (re)loaded\n",0x2c,1,_stderr);
            goto LAB_00192a52;
          }
        }
        fprintf(_stderr,"failed to load session ticket secrets from file:%s:%s\n",uVar1,pcVar5);
        free(src);
        free_tickets(&local_2e8);
      }
    }
    else {
      if (lVar6 != 0) {
        piVar4 = __errno_location();
        strerror_r(*piVar4,local_138,0x100);
        fprintf(_stderr,"cannot load session ticket secrets from file:%s:%s\n",
                conf.ticket.vars.generating.cipher,local_138);
      }
      lVar6 = 0;
    }
LAB_00192a52:
    sleep(10);
  } while( true );
}

Assistant:

H2O_NORETURN static void *ticket_file_updater(void *unused)
{
    time_t last_mtime = 1; /* file is loaded if mtime changes, 0 is used to indicate that the file was missing */

    while (1) {
        struct stat st;
        if (stat(conf.ticket.vars.file.filename, &st) != 0) {
            if (last_mtime != 0) {
                char errbuf[256];
                strerror_r(errno, errbuf, sizeof(errbuf));
                fprintf(stderr, "cannot load session ticket secrets from file:%s:%s\n", conf.ticket.vars.file.filename, errbuf);
            }
            last_mtime = 0;
        } else if (last_mtime != st.st_mtime) {
            /* (re)load */
            last_mtime = st.st_mtime;
            if (load_tickets_file(conf.ticket.vars.file.filename) == 0)
                fprintf(stderr, "session ticket secrets have been (re)loaded\n");
        }
        sleep(10);
    }
}